

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall
t_rb_generator::generate_rb_struct_declaration
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct,bool is_exception)

{
  t_rb_ofstream *ptVar1;
  ostream *poVar2;
  string local_50;
  
  ptVar1 = t_rb_ofstream::indent(out);
  poVar2 = std::operator<<((ostream *)ptVar1,"class ");
  type_name_abi_cxx11_(&local_50,this,&tstruct->super_t_type);
  std::operator<<(poVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (tstruct->is_union_ == true) {
    std::operator<<((ostream *)out," < ::Thrift::Union");
  }
  if (is_exception) {
    std::operator<<((ostream *)out," < ::Thrift::Exception");
  }
  poVar2 = std::operator<<((ostream *)out,"; end");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_rb_struct_declaration(t_rb_ofstream& out, t_struct* tstruct, bool is_exception) {
  out.indent() << "class " << type_name(tstruct);
  if (tstruct->is_union()) {
    out << " < ::Thrift::Union";
  }
  if (is_exception) {
    out << " < ::Thrift::Exception";
  }
  out << "; end" << endl << endl;
}